

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O1

char * ogg_sync_buffer(ogg_sync_state *oy,long size)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uchar *puVar5;
  size_t __size;
  
  if (oy->storage < 0) {
    return (char *)0x0;
  }
  iVar1 = oy->returned;
  if ((long)iVar1 != 0) {
    iVar2 = oy->fill;
    uVar3 = iVar2 - iVar1;
    oy->fill = uVar3;
    if (uVar3 != 0 && iVar1 <= iVar2) {
      memmove(oy->data,oy->data + iVar1,(ulong)uVar3);
    }
    oy->returned = 0;
  }
  lVar4 = (long)oy->fill;
  if (oy->storage - lVar4 < size) {
    if (0x7fffefff - lVar4 < size) {
      if (oy == (ogg_sync_state *)0x0) {
        return (char *)0x0;
      }
    }
    else {
      __size = size + lVar4 + 0x1000;
      if (oy->data == (uchar *)0x0) {
        puVar5 = (uchar *)malloc(__size);
      }
      else {
        puVar5 = (uchar *)realloc(oy->data,__size);
      }
      if (puVar5 != (uchar *)0x0) {
        oy->data = puVar5;
        oy->storage = (int)__size;
        goto LAB_001e55ef;
      }
    }
    if (oy->data != (uchar *)0x0) {
      free(oy->data);
    }
    oy->returned = 0;
    oy->unsynced = 0;
    oy->headerbytes = 0;
    oy->bodybytes = 0;
    oy->data = (uchar *)0x0;
    oy->storage = 0;
    oy->fill = 0;
    return (char *)0x0;
  }
LAB_001e55ef:
  return (char *)(oy->data + oy->fill);
}

Assistant:

char *ogg_sync_buffer(ogg_sync_state *oy, long size){
  if(ogg_sync_check(oy)) return NULL;

  /* first, clear out any space that has been previously returned */
  if(oy->returned){
    oy->fill-=oy->returned;
    if(oy->fill>0)
      memmove(oy->data,oy->data+oy->returned,oy->fill);
    oy->returned=0;
  }

  if(size>oy->storage-oy->fill){
    /* We need to extend the internal buffer */
    long newsize;
    void *ret;

    if(size>INT_MAX-4096-oy->fill){
      ogg_sync_clear(oy);
      return NULL;
    }
    newsize=size+oy->fill+4096; /* an extra page to be nice */
    if(oy->data)
      ret=_ogg_realloc(oy->data,newsize);
    else
      ret=_ogg_malloc(newsize);
    if(!ret){
      ogg_sync_clear(oy);
      return NULL;
    }
    oy->data=ret;
    oy->storage=newsize;
  }

  /* expose a segment at least as large as requested at the fill mark */
  return((char *)oy->data+oy->fill);
}